

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharing.c
# Opt level: O3

uint share_find_unused_id(ssh_sharing_state *sharestate,uint first)

{
  int iVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  int *piVar5;
  int iVar6;
  int low_orig;
  ssh_sharing_connstate dummy;
  int local_40b4;
  uint local_40b0 [4130];
  
  local_40b0[0] = first;
  pvVar4 = findrelpos234(sharestate->connections,local_40b0,(cmpfn234)0x0,4,&local_40b4);
  iVar1 = local_40b4;
  if (pvVar4 != (void *)0x0) {
    iVar2 = count234(sharestate->connections);
    iVar3 = iVar2 - iVar1;
    while (1 < iVar3) {
      iVar3 = (iVar2 + iVar1) / 2;
      piVar5 = (int *)index234(sharestate->connections,iVar3);
      iVar6 = iVar3;
      if (*piVar5 != (iVar3 + first) - local_40b4) {
        iVar6 = iVar1;
        iVar2 = iVar3;
      }
      iVar1 = iVar6;
      iVar3 = iVar2 - iVar6;
    }
    first = ((first + iVar1) - local_40b4) + 1;
    local_40b0[0] = first;
    pvVar4 = find234(sharestate->connections,local_40b0,(cmpfn234)0x0);
    if (pvVar4 != (void *)0x0) {
      __assert_fail("NULL == find234(sharestate->connections, &dummy, NULL)",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/sharing.c"
                    ,0x173,
                    "unsigned int share_find_unused_id(struct ssh_sharing_state *, unsigned int)");
    }
  }
  return first;
}

Assistant:

static unsigned share_find_unused_id
(struct ssh_sharing_state *sharestate, unsigned first)
{
    int low_orig, low, mid, high, high_orig;
    struct ssh_sharing_connstate *cs;
    unsigned ret;

    /*
     * Find the lowest unused downstream ID greater or equal to
     * 'first'.
     *
     * Begin by seeing if 'first' itself is available. If it is, we'll
     * just return it; if it's already in the tree, we'll find the
     * tree index where it appears and use that for the next stage.
     */
    {
        struct ssh_sharing_connstate dummy;
        dummy.id = first;
        cs = findrelpos234(sharestate->connections, &dummy, NULL,
                           REL234_GE, &low_orig);
        if (!cs)
            return first;
    }

    /*
     * Now binary-search using the counted B-tree, to find the largest
     * ID which is in a contiguous sequence from the beginning of that
     * range.
     */
    low = low_orig;
    high = high_orig = count234(sharestate->connections);
    while (high - low > 1) {
        mid = (high + low) / 2;
        cs = index234(sharestate->connections, mid);
        if (cs->id == first + (mid - low_orig))
            low = mid;                 /* this one is still in the sequence */
        else
            high = mid;                /* this one is past the end */
    }

    /*
     * Now low is the tree index of the largest ID in the initial
     * sequence. So the return value is one more than low's id, and we
     * know low's id is given by the formula in the binary search loop
     * above.
     *
     * (If an SSH connection went on for _enormously_ long, we might
     * reach a point where all ids from 'first' to UINT_MAX were in
     * use. In that situation the formula below would wrap round by
     * one and return zero, which is conveniently the right way to
     * signal 'no id available' from this function.)
     */
    ret = first + (low - low_orig) + 1;
    {
        struct ssh_sharing_connstate dummy;
        dummy.id = ret;
        assert(NULL == find234(sharestate->connections, &dummy, NULL));
    }
    return ret;
}